

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O0

SparseMatrix<double,_0,_int> * __thiscall
lf::assemble::COOMatrix<double>::makeSparse
          (SparseMatrix<double,_0,_int> *__return_storage_ptr__,COOMatrix<double> *this)

{
  runtime_error *this_00;
  __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_238;
  __normal_iterator<const_Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  local_230;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [383];
  undefined1 local_19;
  COOMatrix<double> *local_18;
  COOMatrix<double> *this_local;
  SparseMatrix<double,_0,_int> *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (COOMatrix<double> *)__return_storage_ptr__;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(__return_storage_ptr__);
  if ((this->rows_ != 0) && (this->cols_ != 0)) {
    Eigen::SparseMatrix<double,_0,_int>::resize
              (__return_storage_ptr__,(ulong)this->rows_,(ulong)this->cols_);
    local_230._M_current =
         (Triplet<double,_int> *)
         std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
         cbegin(&this->triplets_);
    local_238._M_current =
         (Triplet<double,_int> *)
         std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>::
         cend(&this->triplets_);
    Eigen::SparseMatrix<double,0,int>::
    setFromTriplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>const*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>>
              ((SparseMatrix<double,0,int> *)__return_storage_ptr__,&local_230,&local_238);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"matrix has zero rows or columns, this is probably an error.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"rows_ > 0 && cols_ > 0",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,&local_201);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d8,&local_200,0xb0,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] Eigen::SparseMatrix<Scalar> makeSparse() const {
    Eigen::SparseMatrix<Scalar> result;
    LF_VERIFY_MSG(
        rows_ > 0 && cols_ > 0,
        "matrix has zero rows or columns, this is probably an error.");
    result.resize(rows_, cols_);
    result.setFromTriplets(triplets_.cbegin(), triplets_.cend());
    return result;
  }